

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::VerifyMarkRoots(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  GuestArenaAllocator *pGVar4;
  ArenaData **ppAVar5;
  EntryType *pEVar6;
  ulong uVar7;
  undefined1 local_50 [8];
  Iterator guestArenaIter;
  Iterator externalGuestArenaIter;
  
  VerifyMark(this,(void *)0x0,this->transientPinnedObject);
  if ((this->pinnedObjectMap).size != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar7 = 0;
    do {
      for (pEVar6 = (this->pinnedObjectMap).table[uVar7]; pEVar6 != (EntryType *)0x0;
          pEVar6 = pEVar6->next) {
        if ((pEVar6->value).refCount == 0) {
          if (this->hasPendingUnpinnedObject == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                               ,0x212d,"(this->hasPendingUnpinnedObject)",
                               "this->hasPendingUnpinnedObject");
            if (!bVar2) goto LAB_00722f1f;
            *puVar3 = 0;
          }
        }
        else {
          VerifyMark(this,(void *)0x0,pEVar6->key);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->pinnedObjectMap).size);
  }
  local_50 = (undefined1  [8])&this->guestArenaList;
  guestArenaIter.list = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_50;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00722dad:
  if (guestArenaIter.list == (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar2) goto LAB_00722f1f;
    *puVar3 = 0;
  }
  guestArenaIter.list =
       ((guestArenaIter.list)->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list
  ;
  if ((undefined1  [8])guestArenaIter.list == local_50) {
    externalGuestArenaIter.list = &this->externalGuestArenaList;
    guestArenaIter.list = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    guestArenaIter.current = (NodeBase *)externalGuestArenaIter.list;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    goto LAB_00722ea5;
  }
  pGVar4 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)local_50);
  if (pGVar4->pendingDelete == true) {
    if (this->hasPendingDeleteGuestArena == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x213c,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar2) goto LAB_00722f1f;
      *puVar3 = 0;
    }
  }
  else {
    pGVar4 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_50);
    VerifyMarkArena(this,&(pGVar4->super_ArenaAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          super_ArenaData);
  }
  goto LAB_00722dad;
LAB_00722ea5:
  if (externalGuestArenaIter.list == (DListBase<Memory::ArenaData_*,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar2) {
LAB_00722f1f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  externalGuestArenaIter.list =
       ((externalGuestArenaIter.list)->super_DListNodeBase<Memory::ArenaData_*>).next.list;
  if (externalGuestArenaIter.list ==
      (DListBase<Memory::ArenaData_*,_RealCount> *)guestArenaIter.current) {
    return;
  }
  ppAVar5 = DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Data
                      ((Iterator *)&guestArenaIter.current);
  VerifyMarkArena(this,*ppAVar5);
  goto LAB_00722ea5;
}

Assistant:

void
Recycler::VerifyMarkRoots()
{
    {
        this->VerifyMark(transientPinnedObject);
        pinnedObjectMap.Map([this](void * obj, PinRecord const &refCount)
        {
            if (refCount == 0)
            {
                Assert(this->hasPendingUnpinnedObject);
            }
            else
            {
                // Use the pinrecord as the source reference
                this->VerifyMark(obj);
            }
        });
    }

    DList<GuestArenaAllocator, HeapAllocator>::Iterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        if (guestArenaIter.Data().pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
        }
        else
        {
            VerifyMarkArena(&guestArenaIter.Data());
        }
    }

    DList<ArenaData *, HeapAllocator>::Iterator externalGuestArenaIter(&externalGuestArenaList);
    while (externalGuestArenaIter.Next())
    {
        VerifyMarkArena(externalGuestArenaIter.Data());
    }

    // We can't check external roots here
}